

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPackingFunctionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::ShaderPackingFunctionCase::init
          (ShaderPackingFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  ShaderExecutor *pSVar2;
  TestError *this_00;
  allocator<char> local_39;
  string local_38;
  
  pSVar2 = deqp::gls::ShaderExecUtil::createExecutor
                     (((this->super_TestCase).m_context)->m_renderCtx,this->m_shaderType,
                      &this->m_spec);
  this->m_executor = pSVar2;
  (*pSVar2->_vptr_ShaderExecutor[3])
            (pSVar2,((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  iVar1 = (*this->m_executor->_vptr_ShaderExecutor[2])();
  if ((char)iVar1 != '\0') {
    return iVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Compile failed",&local_39)
  ;
  tcu::TestError::TestError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderPackingFunctionCase::init (void)
{
	DE_ASSERT(!m_executor);

	m_executor = createExecutor(m_context.getRenderContext(), m_shaderType, m_spec);
	m_testCtx.getLog() << m_executor;

	if (!m_executor->isOk())
		throw tcu::TestError("Compile failed");
}